

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Constraint * __thiscall am_CList::Remove_Dep(am_CList *this,CItem *item)

{
  CItem *pCVar1;
  CItem *pCVar2;
  Am_Constraint *pAVar3;
  CItem **ppCVar4;
  
  pCVar1 = (item->field_1).prev;
  pCVar2 = item->next;
  ppCVar4 = &pCVar1->next;
  if (pCVar1 == (CItem *)0x0) {
    ppCVar4 = &this->head;
  }
  *ppCVar4 = pCVar2;
  if (pCVar2 != (CItem *)0x0) {
    (pCVar2->field_1).prev = pCVar1;
  }
  pAVar3 = item->value;
  item->value = (Am_Constraint *)0x0;
  (item->field_1).prev = (CItem *)0x0;
  item->next = (CItem *)0x0;
  CItem::operator_delete(item,0x18);
  return pAVar3;
}

Assistant:

Am_Constraint *
am_CList::Remove_Dep(CItem *item)
{
  CItem *prev = item->prev;
  CItem *next = item->next;
  if (prev)
    prev->next = next;
  else
    head = next;
  if (next)
    next->prev = prev;
  Am_Constraint *value = item->value;
  item->prev = nullptr;
  item->next = nullptr;
  item->value = nullptr;
  delete item;
  return value;
}